

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_image_section_cache.c
# Opt level: O0

int pt_iscache_expand(pt_image_section_cache *iscache)

{
  ushort uVar1;
  pt_iscache_entry *ppVar2;
  uint16_t target;
  uint16_t capacity;
  pt_iscache_entry *entries;
  pt_image_section_cache *iscache_local;
  
  if (iscache == (pt_image_section_cache *)0x0) {
    iscache_local._4_4_ = -1;
  }
  else {
    uVar1 = iscache->capacity + 8;
    if (uVar1 < iscache->capacity) {
      iscache_local._4_4_ = -9;
    }
    else {
      ppVar2 = (pt_iscache_entry *)realloc(iscache->entries,(ulong)uVar1 << 4);
      if (ppVar2 == (pt_iscache_entry *)0x0) {
        iscache_local._4_4_ = -9;
      }
      else {
        iscache->capacity = uVar1;
        iscache->entries = ppVar2;
        iscache_local._4_4_ = 0;
      }
    }
  }
  return iscache_local._4_4_;
}

Assistant:

static int pt_iscache_expand(struct pt_image_section_cache *iscache)
{
	struct pt_iscache_entry *entries;
	uint16_t capacity, target;

	if (!iscache)
		return -pte_internal;

	capacity = iscache->capacity;
	target = capacity + 8;

	/* Check for overflows. */
	if (target < capacity)
		return -pte_nomem;

	entries = realloc(iscache->entries, target * sizeof(*entries));
	if (!entries)
		return -pte_nomem;

	iscache->capacity = target;
	iscache->entries = entries;
	return 0;
}